

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O1

void nn_ctcp_start_resolving(nn_ctcp *self)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  char *addr;
  int ipv4only;
  size_t ipv4onlylen;
  int local_34;
  size_t local_30;
  
  __s = nn_ep_getaddr(self->ep);
  pcVar1 = strchr(__s,0x3b);
  pcVar2 = strrchr(__s,0x3a);
  if (pcVar2 == (char *)0x0) {
    nn_ctcp_start_resolving_cold_2();
  }
  else {
    local_30 = 4;
    nn_ep_getopt(self->ep,0,0xe,&local_34,&local_30);
    if (local_30 == 4) {
      addr = pcVar1 + 1;
      if (pcVar1 == (char *)0x0) {
        addr = __s;
      }
      nn_dns_start(&self->dns,addr,(long)pcVar2 - (long)addr,local_34,&self->dns_result);
      self->state = 2;
      return;
    }
  }
  nn_ctcp_start_resolving_cold_1();
}

Assistant:

static void nn_ctcp_start_resolving (struct nn_ctcp *self)
{
    const char *addr;
    const char *begin;
    const char *end;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Extract the hostname part from address string. */
    addr = nn_ep_getaddr (self->ep);
    begin = strchr (addr, ';');
    if (!begin)
        begin = addr;
    else
        ++begin;
    end = strrchr (addr, ':');
    nn_assert (end);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  TODO: Get the actual value of IPV4ONLY option. */
    nn_dns_start (&self->dns, begin, end - begin, ipv4only, &self->dns_result);

    self->state = NN_CTCP_STATE_RESOLVING;
}